

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebFront.hpp
# Opt level: O3

void __thiscall
webfront::
BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
::BasicWF(BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
          *this,string_view port,path *docRoot)

{
  _Rb_tree_header *p_Var1;
  string_view address;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  path local_50;
  
  http::std::filesystem::__cxx11::path::path(&local_50,docRoot);
  address._M_str = "0.0.0.0";
  address._M_len = 7;
  http::
  Server<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
  ::Server(&this->httpServer,address,port,&local_50);
  http::std::filesystem::__cxx11::path::~path(&local_50);
  p_Var1 = &(this->webLinks)._M_t._M_impl.super__Rb_tree_header;
  (this->webLinks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->webLinks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->webLinks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->webLinks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->webLinks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->idsCounter = 0;
  *(undefined8 *)&(this->uiStartedHandler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->uiStartedHandler).super__Function_base._M_functor + 8) = 0;
  (this->uiStartedHandler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->uiStartedHandler)._M_invoker = (_Invoker_type)0x0;
  p_Var1 = &(this->cppFunctions)._M_t._M_impl.super__Rb_tree_header;
  (this->cppFunctions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->cppFunctions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->cppFunctions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->cppFunctions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->cppFunctions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70._8_8_ = 0;
  local_58 = http::std::
             _Function_handler<void_(std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>_&&,_webfront::http::Protocol),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ambroise-leclerc[P]WebFront/include/WebFront.hpp:69:30)>
             ::_M_invoke;
  local_60 = http::std::
             _Function_handler<void_(std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>_&&,_webfront::http::Protocol),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ambroise-leclerc[P]WebFront/include/WebFront.hpp:69:30)>
             ::_M_manager;
  local_70._M_unused._M_object = this;
  std::
  function<void(std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>,webfront::http::Protocol)>
  ::operator=((function<void(std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>,webfront::http::Protocol)>
               *)&(this->httpServer).upgradeHandler,
              (function<void_(std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>_&&,_webfront::http::Protocol)>
               *)&local_70);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  return;
}

Assistant:

BasicWF(std::string_view port, std::filesystem::path docRoot = ".") : httpServer("0.0.0.0", port, docRoot), idsCounter(0) {
        httpServer.onUpgrade([this](typename Net::Socket&& socket, http::Protocol protocol) {
            if (protocol == http::Protocol::WebSocket)
                for (bool inserted = false; !inserted; ++idsCounter)
                    std::tie(std::ignore, inserted) = webLinks.try_emplace(idsCounter, std::move(socket), idsCounter,
                                                                           [this](WebLinkEvent event) { onEvent(event); });
        });
    }